

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O0

void finish(OjaNewton *ON)

{
  long in_RDI;
  int i;
  undefined4 local_c;
  
  free(*(void **)(in_RDI + 0x20));
  free(*(void **)(in_RDI + 0x28));
  free(*(void **)(in_RDI + 0x30));
  free(*(void **)(in_RDI + 0x60));
  free(*(void **)(in_RDI + 0x68));
  free(*(void **)(in_RDI + 0x48));
  free(*(void **)(in_RDI + 0x50));
  free(*(void **)(in_RDI + 0x58));
  for (local_c = 1; local_c <= *(int *)(in_RDI + 8); local_c = local_c + 1) {
    free(*(void **)(*(long *)(in_RDI + 0x38) + (long)local_c * 8));
    free(*(void **)(*(long *)(in_RDI + 0x40) + (long)local_c * 8));
  }
  free(*(void **)(in_RDI + 0x38));
  free(*(void **)(in_RDI + 0x40));
  free(*(void **)(in_RDI + 0x88));
  free(*(void **)(in_RDI + 0x90));
  free(*(void **)(in_RDI + 0x98));
  return;
}

Assistant:

void finish(OjaNewton& ON)
{
  free(ON.ev);
  free(ON.b);
  free(ON.D);
  free(ON.buffer);
  free(ON.weight_buffer);
  free(ON.zv);
  free(ON.vv);
  free(ON.tmp);

  for (int i = 1; i <= ON.m; i++)
  {
    free(ON.A[i]);
    free(ON.K[i]);
  }
  free(ON.A);
  free(ON.K);

  free(ON.data.Zx);
  free(ON.data.AZx);
  free(ON.data.delta);
}